

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

SPIRExpression * __thiscall
spirv_cross::CompilerGLSL::emit_op
          (CompilerGLSL *this,uint32_t result_type,uint32_t result_id,string *rhs,bool forwarding,
          bool suppress_usage_tracking)

{
  uint32_t id;
  iterator iVar1;
  SPIRExpression *pSVar2;
  undefined7 in_register_00000081;
  uint32_t result_id_local;
  uint32_t result_type_local;
  bool local_41;
  string local_40;
  
  result_id_local = result_id;
  result_type_local = result_type;
  if (((int)CONCAT71(in_register_00000081,forwarding) == 0) ||
     (iVar1 = ::std::
              _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              ::find(&(this->super_Compiler).forced_temporaries._M_h,&result_id_local),
     iVar1.super__Node_iterator_base<unsigned_int,_false>._M_cur != (__node_type *)0x0)) {
    declare_temporary_abi_cxx11_(&local_40,this,result_type_local,result_id_local);
    statement<std::__cxx11::string,std::__cxx11::string_const&,char_const(&)[2]>
              (this,&local_40,rhs,(char (*) [2])0x297c5b);
    ::std::__cxx11::string::~string((string *)&local_40);
    id = result_id_local;
    (*(this->super_Compiler)._vptr_Compiler[6])(&local_40,this,(ulong)result_id_local,1);
    local_41 = true;
    pSVar2 = Compiler::set<spirv_cross::SPIRExpression,std::__cxx11::string,unsigned_int&,bool>
                       (&this->super_Compiler,id,&local_40,&result_type_local,&local_41);
    ::std::__cxx11::string::~string((string *)&local_40);
  }
  else {
    ::std::__detail::
    _Insert_base<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::insert((_Insert_base<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              *)&(this->super_Compiler).forwarded_temporaries,&result_id_local);
    if (suppress_usage_tracking) {
      ::std::__detail::
      _Insert_base<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::insert((_Insert_base<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                *)&(this->super_Compiler).suppressed_usage_tracking,&result_id_local);
    }
    local_40._M_dataplus._M_p._0_1_ = 1;
    pSVar2 = Compiler::
             set<spirv_cross::SPIRExpression,std::__cxx11::string_const&,unsigned_int&,bool>
                       (&this->super_Compiler,result_id_local,rhs,&result_type_local,
                        (bool *)&local_40);
  }
  return pSVar2;
}

Assistant:

SPIRExpression &CompilerGLSL::emit_op(uint32_t result_type, uint32_t result_id, const string &rhs, bool forwarding,
                                      bool suppress_usage_tracking)
{
	if (forwarding && (forced_temporaries.find(result_id) == end(forced_temporaries)))
	{
		// Just forward it without temporary.
		// If the forward is trivial, we do not force flushing to temporary for this expression.
		forwarded_temporaries.insert(result_id);
		if (suppress_usage_tracking)
			suppressed_usage_tracking.insert(result_id);

		return set<SPIRExpression>(result_id, rhs, result_type, true);
	}
	else
	{
		// If expression isn't immutable, bind it to a temporary and make the new temporary immutable (they always are).
		statement(declare_temporary(result_type, result_id), rhs, ";");
		return set<SPIRExpression>(result_id, to_name(result_id), result_type, true);
	}
}